

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

Result __thiscall
tonk::gateway::SSDPRequester::OnUDPDatagram(SSDPRequester *this,char *data,uint bytes)

{
  _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *p_Var1;
  Result RVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  StateMachine *this_00;
  long lVar6;
  ulong in_RCX;
  undefined4 in_register_00000014;
  Result *success;
  size_type sVar7;
  ErrorResult *pEVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Alloc_hider __it_00;
  ParsedURL *this_01;
  _Alloc_hider _Var9;
  _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *p_Var10;
  Result result;
  string url;
  string line;
  undefined1 local_258 [8];
  undefined1 local_250 [8];
  ParsedURL parsed;
  ErrorResult *local_1a0;
  ErrorResult *local_198;
  ErrorResult *local_190;
  membuf sbuf;
  istream is;
  
  membuf::membuf((membuf *)&sbuf.super_streambuf,(char *)CONCAT44(in_register_00000014,bytes),
                 (char *)CONCAT44(in_register_00000014,bytes) + (in_RCX & 0xffffffff));
  std::istream::istream(&is,&sbuf.super_streambuf);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(&is,(string *)&line);
  if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
    lVar6 = std::__cxx11::string::find((char *)&line,0x1a27a7);
    if (lVar6 == -1) {
      std::__cxx11::string::string
                ((string *)&parsed,"Ignoring malformed UDP response (No \"200 OK\")",
                 (allocator *)&url);
      this_00 = (StateMachine *)operator_new(0x38);
      ErrorResult::ErrorResult((ErrorResult *)this_00,&parsed.FullURL);
    }
    else {
      do {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(&is,(string *)&line)
        ;
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
          std::__cxx11::string::string((string *)&parsed,"No location found",(allocator *)&url);
          this_00 = (StateMachine *)operator_new(0x38);
          ErrorResult::ErrorResult((ErrorResult *)this_00,&parsed.FullURL);
          goto LAB_0015f4fb;
        }
        std::__cxx11::string::substr((ulong)&parsed,(ulong)&line);
        iVar4 = strcasecmp(parsed.FullURL._M_dataplus._M_p,"location:");
        std::__cxx11::string::~string((string *)&parsed);
      } while (iVar4 != 0);
      lVar6 = std::__cxx11::string::find((char *)&line,0x1a27e6);
      if (lVar6 != -1) {
        __it._M_current = (char *)&line;
        std::__cxx11::string::string
                  ((string *)&url,(string *)__it._M_current,lVar6 + 3,(allocator *)&parsed);
        __it_00 = url._M_dataplus;
        p_Var1 = (_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                 (url._M_dataplus._M_p + url._M_string_length);
        sVar7 = url._M_string_length;
        _Var9 = url._M_dataplus;
        for (lVar6 = (long)url._M_string_length >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)_Var9._M_p,__it);
          p_Var10 = (_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                    _Var9._M_p;
          if (bVar3) goto LAB_0015f76d;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)_Var9._M_p + 1,__it);
          p_Var10 = (_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                    _Var9._M_p + 1;
          if (bVar3) goto LAB_0015f76d;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)_Var9._M_p + 2,__it);
          p_Var10 = (_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                    _Var9._M_p + 2;
          if (bVar3) goto LAB_0015f76d;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)_Var9._M_p + 3,__it);
          p_Var10 = (_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                    _Var9._M_p + 3;
          if (bVar3) goto LAB_0015f76d;
          _Var9._M_p = _Var9._M_p + 4;
          sVar7 = sVar7 - 4;
        }
        if (sVar7 == 1) {
LAB_0015f75a:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)_Var9._M_p,__it);
          p_Var10 = p_Var1;
          if (bVar3) {
            p_Var10 = (_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                      _Var9._M_p;
          }
        }
        else if (sVar7 == 2) {
LAB_0015f73f:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)_Var9._M_p,__it);
          p_Var10 = (_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                    _Var9._M_p;
          if (!bVar3) {
            _Var9._M_p = _Var9._M_p + 1;
            goto LAB_0015f75a;
          }
        }
        else {
          p_Var10 = p_Var1;
          if ((sVar7 == 3) &&
             (bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::
                      operator()((_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_>
                                  *)_Var9._M_p,__it),
             p_Var10 = (_Iter_pred<tonk::gateway::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                       _Var9._M_p, !bVar3)) {
            _Var9._M_p = _Var9._M_p + 1;
            goto LAB_0015f73f;
          }
        }
LAB_0015f76d:
        std::__cxx11::string::erase(&url,__it_00._M_p,p_Var10);
        sVar7 = url._M_string_length;
        for (lVar6 = (long)url._M_string_length >> 2;
            pEVar8 = (ErrorResult *)(url._M_dataplus._M_p + sVar7), _Var9._M_p = (pointer)pEVar8,
            0 < lVar6; lVar6 = lVar6 + -1) {
          parsed.FullURL._M_dataplus._M_p = (pointer)pEVar8;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)&parsed,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
          if (bVar3) goto LAB_0015f833;
          result.Error = (ErrorResult *)(url._M_dataplus._M_p + (sVar7 - 1));
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)&result,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
          _Var9._M_p = url._M_dataplus._M_p + (sVar7 - 1);
          if (bVar3) goto LAB_0015f833;
          local_250 = (undefined1  [8])(url._M_dataplus._M_p + (sVar7 - 2));
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)local_250,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
          _Var9._M_p = (pointer)(url._M_dataplus._M_p + (sVar7 - 2));
          if (bVar3) goto LAB_0015f833;
          local_258 = (undefined1  [8])(url._M_dataplus._M_p + (sVar7 - 3));
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)local_258,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
          _Var9._M_p = (pointer)(url._M_dataplus._M_p + (sVar7 - 3));
          if (bVar3) goto LAB_0015f833;
          sVar7 = sVar7 - 4;
        }
        if (sVar7 == 3) {
          local_190 = pEVar8;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)&local_190,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
          if (!bVar3) {
            pEVar8 = (ErrorResult *)(url._M_dataplus._M_p + 2);
            goto LAB_0015f924;
          }
        }
        else {
          if (sVar7 == 2) {
LAB_0015f924:
            local_198 = pEVar8;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::
                    operator()((_Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::_lambda(int)_1_>
                                *)&local_198,
                               (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)__it_00._M_p);
            _Var9._M_p = (pointer)pEVar8;
            if (bVar3) goto LAB_0015f833;
            pEVar8 = (ErrorResult *)((long)&pEVar8[-1].Code + 7);
          }
          else {
            _Var9 = url._M_dataplus;
            if (sVar7 != 1) goto LAB_0015f833;
          }
          local_1a0 = pEVar8;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::
                  operator()((_Iter_pred<tonk::gateway::rtrim(std::__cxx11::string&)::_lambda(int)_1_>
                              *)&local_1a0,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__it_00._M_p);
          _Var9 = url._M_dataplus;
          if (bVar3) {
            _Var9._M_p = (pointer)pEVar8;
          }
        }
LAB_0015f833:
        std::__cxx11::string::erase(&url,_Var9._M_p,url._M_dataplus._M_p + url._M_string_length);
        parsed.FullURL._M_dataplus._M_p = (pointer)&parsed.FullURL.field_2;
        parsed.XMLPath._M_dataplus._M_p = (pointer)&parsed.XMLPath.field_2;
        parsed.IP._M_dataplus._M_p = (pointer)&parsed.IP.field_2;
        parsed.FullURL._M_string_length = 0;
        parsed.FullURL.field_2._M_local_buf[0] = '\0';
        parsed.XMLPath._M_string_length = 0;
        parsed.XMLPath.field_2._M_local_buf[0] = '\0';
        parsed.IP._M_string_length = 0;
        parsed.IP.field_2._M_local_buf[0] = '\0';
        parsed.IPAddr.type_ = ipv4;
        parsed.IPAddr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
        parsed.IPAddr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        parsed.IPAddr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        parsed.IPAddr.ipv6_address_.scope_id_ = 0;
        parsed.TCPEndpoint.impl_.data_.v6.sin6_scope_id = 0;
        parsed.TCPEndpoint.impl_.data_.v6.sin6_addr.__in6_u = (in6_addr)(ZEXT416(0) << 0x40);
        parsed.TCPEndpoint.impl_.data_._0_8_ = 2;
        ParsedURL::Parse((ParsedURL *)&result,&parsed.FullURL);
        RVar2 = result;
        if (result.Error == (ErrorResult *)0x0) {
          StateMachine::OnSSDPResponse(*(StateMachine **)data,&parsed);
          this->State = (StateMachine *)0x0;
        }
        else {
          result.Error = (ErrorResult *)0x0;
          this->State = (StateMachine *)RVar2.Error;
        }
        Result::~Result(&result);
        ParsedURL::~ParsedURL(&parsed);
        this_01 = (ParsedURL *)&url;
        goto LAB_0015f503;
      }
      std::__cxx11::string::string
                ((string *)&parsed,"Ignoring malformed UDP response (No protocol)",(allocator *)&url
                );
      this_00 = (StateMachine *)operator_new(0x38);
      ErrorResult::ErrorResult((ErrorResult *)this_00,&parsed.FullURL);
    }
  }
  else {
    std::__cxx11::string::string((string *)&parsed,"Truncated UDP response",(allocator *)&url);
    this_00 = (StateMachine *)operator_new(0x38);
    ErrorResult::ErrorResult((ErrorResult *)this_00,&parsed.FullURL);
  }
LAB_0015f4fb:
  this_01 = &parsed;
  this->State = this_00;
LAB_0015f503:
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&line);
  std::istream::~istream(&is);
  std::streambuf::~streambuf(&sbuf);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SSDPRequester::OnUDPDatagram(char* data, unsigned bytes)
{
    membuf sbuf(data, data + bytes);
    std::istream is(&sbuf);

    std::string line;

    // Check if response starts with a success code
    if (!std::getline(is, line)) {
        return Result("Truncated UDP response");
    }
    if (line.find("200 OK") == std::string::npos) {
        return Result("Ignoring malformed UDP response (No \"200 OK\")");
    }

    //ModuleLogger.Info("**** ", SourceAddress.address().to_string(), ":", SourceAddress.port());

    // For each remaining line:
    while (std::getline(is, line))
    {
        //ModuleLogger.Info("LINE: ", line);

        const bool isLocation = (0 == StrCaseCompare(line.substr(0, 9).c_str(), "location:"));
        if (!isLocation) {
            continue;
        }

        // Parse out the first HTTP or HTTPS URL in the response.
        const std::string::size_type begin = line.find("://");
        if (begin == std::string::npos) {
            return Result("Ignoring malformed UDP response (No protocol)");
        }
        std::string url(line, begin + 3);
        trim(url);

        ParsedURL parsed;
        Result result = parsed.Parse(url);
        if (result.IsFail()) {
            return result;
        }

        State->OnSSDPResponse(parsed);
        return Result::Success();
    }

    return Result("No location found");
}